

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O0

void __thiscall Prog::redraw(Prog *this)

{
  Element *pEVar1;
  Element *pEVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  reference ppEVar6;
  __normal_iterator<Element_**,_std::vector<Element_*,_std::allocator<Element_*>_>_> *in_RDI;
  float fVar7;
  bool in_stack_0000001f;
  float in_stack_00000020;
  float in_stack_00000024;
  Context *in_stack_00000028;
  Element *in_stack_00000030;
  float th;
  float y;
  bool in_stack_00000047;
  Context *in_stack_00000048;
  bool highlight;
  Element *in_stack_00000050;
  iter it;
  vector<Element_*,_std::allocator<Element_*>_> *in_stack_ffffffffffffff88;
  __normal_iterator<Element_**,_std::vector<Element_*,_std::allocator<Element_*>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<Element_**,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_20;
  Element **local_18;
  Element **ppEStack_10;
  
  local_18 = in_RDI[3]._M_current;
  ppEStack_10 = in_RDI[4]._M_current;
  al_clear_to_color((int)local_18,ppEStack_10);
  local_20._M_current =
       (Element **)
       std::vector<Element_*,_std::allocator<Element_*>_>::begin(in_stack_ffffffffffffff88);
  while( true ) {
    std::vector<Element_*,_std::allocator<Element_*>_>::end(in_stack_ffffffffffffff88);
    bVar3 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<Element_**,_std::vector<Element_*,_std::allocator<Element_*>_>_>
                               *)in_stack_ffffffffffffff88);
    if (!bVar3) break;
    ppEVar6 = __gnu_cxx::
              __normal_iterator<Element_**,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
              operator*(&local_20);
    pEVar1 = *ppEVar6;
    pEVar2 = (Element *)in_RDI[0x17]._M_current;
    __gnu_cxx::__normal_iterator<Element_**,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator*(&local_20);
    Element::draw(in_stack_00000050,in_stack_00000048,in_stack_00000047);
    if ((pEVar1 == pEVar2) && (*(int *)&in_RDI[0x16]._M_current == 2)) {
      __gnu_cxx::__normal_iterator<Element_**,_std::vector<Element_*,_std::allocator<Element_*>_>_>
      ::operator*(&local_20);
      Element::draw_arrow(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000020,
                          in_stack_0000001f);
    }
    __gnu_cxx::__normal_iterator<Element_**,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
    operator++(in_stack_ffffffffffffff98,(int)((ulong)in_RDI >> 0x20));
  }
  iVar4 = al_get_display_height(in_RDI->_M_current);
  iVar5 = al_get_font_line_height(in_RDI[2]._M_current);
  fVar7 = (float)iVar5;
  al_draw_textf((int)in_RDI[5]._M_current,in_RDI[6]._M_current,0,(float)iVar4 - (fVar7 + fVar7),
                in_RDI[2]._M_current,0,
                "Create [v]oices, [m]ixers, [s]ample instances, [a]udiostreams.   [SPACE] pause playback.    [1]-[9] set sample.    [x] delete."
               );
  al_draw_textf((int)in_RDI[5]._M_current,in_RDI[6]._M_current,0,(float)iVar4 - fVar7,
                in_RDI[2]._M_current,0,
                "Mouse: [LMB] select element.   [RMB] attach sources to sinks (sample->mixer, mixer->mixer, mixer->voice, sample->voice)"
               );
  al_flip_display();
  return;
}

Assistant:

void Prog::redraw()
{
   al_clear_to_color(ctx.bg);

   for (Element::iter it = elements.begin(); it != elements.end(); it++) {
      bool highlight = (*it == cur_element);
      (*it)->draw(ctx, highlight);

      if (highlight && cur_button == 2) {
         (*it)->draw_arrow(ctx, connect_x, connect_y, highlight);
      }
   }

   float y = al_get_display_height(dpy);
   float th = al_get_font_line_height(ctx.font);
   al_draw_textf(ctx.font, ctx.fg, 0, y-th*2, ALLEGRO_ALIGN_LEFT,
      "Create [v]oices, [m]ixers, [s]ample instances, [a]udiostreams.   "
      "[SPACE] pause playback.    "
      "[1]-[9] set sample.    "
      "[x] delete.");
   al_draw_textf(ctx.font, ctx.fg, 0, y-th*1, ALLEGRO_ALIGN_LEFT,
      "Mouse: [LMB] select element.   "
      "[RMB] attach sources to sinks "
      "(sample->mixer, mixer->mixer, mixer->voice, sample->voice)");

   al_flip_display();
}